

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask15_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x4438302820181008));
  vpmovsxbd_avx2(ZEXT816(0x40342c241c140c04));
  uVar1 = in[0x17];
  auVar11 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] * 2)));
  auVar10 = vpsrlvd_avx2(auVar11._0_16_,_DAT_001a0660);
  auVar12 = vpgatherdd_avx512vl(*in);
  auVar7 = vpsllvd_avx2(auVar12,_DAT_0019ef40);
  auVar8 = vpsllvd_avx2(auVar11,_DAT_0019ef80);
  auVar12 = valignd_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar10),7);
  uVar2 = in[0x13];
  auVar12 = vpblendd_avx2(auVar12,ZEXT432(*in),1);
  auVar10 = vpshufd_avx(auVar11._16_16_,0x50);
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_001a2670);
  auVar13._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar12._0_16_;
  auVar13._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar10;
  auVar12 = vpblendd_avx2(auVar12,auVar13,0x60);
  auVar13 = vpbroadcastd_avx512vl();
  uVar3 = in[0x15];
  auVar12 = vpblendd_avx2(auVar12,auVar13,0x80);
  auVar12 = vpternlogd_avx512vl(auVar8,auVar7,auVar12,0xfe);
  uVar4 = in[0x12];
  auVar10 = vpshufd_avx(auVar11._16_16_,0xff);
  *(undefined1 (*) [32])out = auVar12;
  auVar10 = vpinsrd_avx(auVar10,uVar2,1);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_001adc30);
  uVar5 = in[0x16];
  auVar10 = vpinsrd_avx(ZEXT416(uVar2),uVar3,1);
  auVar6 = vpsllvd_avx2(auVar10,_DAT_001adc40);
  auVar10 = vpinsrd_avx(ZEXT416(uVar4),in[0x14],1);
  auVar10 = vpsllvd_avx2(auVar10,_DAT_001a2380);
  auVar10 = vpternlogd_avx512vl(auVar6,auVar10,auVar9,0xfe);
  *(long *)(out + 8) = auVar10._0_8_;
  out[10] = uVar1 << 0x19 | uVar5 << 10 | uVar3 >> 5;
  out[0xb] = uVar1 >> 7;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask15_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (15 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (15 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (15 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (15 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (15 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (15 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (15 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (15 - 8);
  ++in;

  return out + 1;
}